

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::SHA1Operator>>
               (string_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Vector *vector;
  ulong uVar12;
  ulong uVar13;
  string_t sVar14;
  string_t input;
  string_t input_00;
  Vector *vector_1;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar8 = 8;
      do {
        sVar14.value.pointer.ptr = (char *)dataptr;
        sVar14.value._0_8_ = *(undefined8 *)((long)&ldata->value + lVar8);
        sVar14 = SHA1Operator::Operation<duckdb::string_t,duckdb::string_t>
                           (*(SHA1Operator **)((long)ldata + lVar8 + -8),sVar14,(Vector *)mask);
        *(long *)((long)result_data + lVar8 + -8) = sVar14.value._0_8_;
        *(long *)((long)&result_data->value + lVar8) = sVar14.value._8_8_;
        lVar8 = lVar8 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar10 = 0;
      pVVar6 = (Vector *)0x0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
LAB_009f9bf1:
          uVar4 = uVar10;
          if (uVar10 < uVar13) {
            uVar9 = uVar10 << 4 | 8;
            pVVar7 = pVVar6;
            do {
              input.value.pointer.ptr = (char *)dataptr;
              input.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar9);
              sVar14 = SHA1Operator::Operation<duckdb::string_t,duckdb::string_t>
                                 (*(SHA1Operator **)((long)ldata + (uVar9 - 8)),input,pVVar7);
              *(long *)((long)result_data + (uVar9 - 8)) = sVar14.value._0_8_;
              *(long *)((long)&result_data->value + uVar9) = sVar14.value._8_8_;
              uVar10 = uVar10 + 1;
              uVar9 = uVar9 + 0x10;
              uVar4 = uVar13;
            } while (uVar13 != uVar10);
          }
        }
        else {
          uVar9 = puVar1[(long)pVVar6];
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
          uVar4 = uVar13;
          if (uVar9 != 0) {
            if (uVar9 == 0xffffffffffffffff) goto LAB_009f9bf1;
            uVar4 = uVar10;
            if (uVar10 < uVar13) {
              uVar11 = uVar10 << 4 | 8;
              uVar12 = 0;
              pVVar7 = pVVar6;
              do {
                if ((uVar9 >> (uVar12 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)dataptr;
                  input_00.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar11);
                  sVar14 = SHA1Operator::Operation<duckdb::string_t,duckdb::string_t>
                                     (*(SHA1Operator **)((long)ldata + (uVar11 - 8)),input_00,pVVar7
                                     );
                  *(long *)((long)result_data + (uVar11 - 8)) = sVar14.value._0_8_;
                  *(long *)((long)&result_data->value + uVar11) = sVar14.value._8_8_;
                }
                uVar12 = uVar12 + 1;
                uVar11 = uVar11 + 0x10;
                uVar4 = uVar13;
              } while (uVar13 - uVar10 != uVar12);
            }
          }
        }
        uVar10 = uVar4;
        pVVar6 = (Vector *)&pVVar6->field_0x1;
      } while (pVVar6 != (Vector *)(count + 0x3f >> 6));
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}